

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOSXBundleGenerator.cxx
# Opt level: O3

void __thiscall
cmOSXBundleGenerator::GenerateMacOSXContentStatements
          (cmOSXBundleGenerator *this,
          vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *sources,
          MacOSXContentGeneratorType *generator,string *config)

{
  pointer ppcVar1;
  cmSourceFile *sf;
  bool bVar2;
  pointer ppcVar3;
  SourceFileFlags SVar4;
  
  bVar2 = cmGeneratorTarget::HaveWellDefinedOutputFiles(this->GT);
  if (bVar2) {
    ppcVar1 = (sources->
              super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>).
              _M_impl.super__Vector_impl_data._M_finish;
    for (ppcVar3 = (sources->
                   super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>).
                   _M_impl.super__Vector_impl_data._M_start; ppcVar3 != ppcVar1;
        ppcVar3 = ppcVar3 + 1) {
      sf = *ppcVar3;
      SVar4 = cmGeneratorTarget::GetTargetSourceFileFlags(this->GT,sf);
      if (SVar4.Type != SourceFileTypeNormal) {
        (*generator->_vptr_MacOSXContentGeneratorType[2])(generator,sf,SVar4.MacFolder,config);
      }
    }
  }
  return;
}

Assistant:

void cmOSXBundleGenerator::GenerateMacOSXContentStatements(
  std::vector<cmSourceFile const*> const& sources,
  MacOSXContentGeneratorType* generator, const std::string& config)
{
  if (this->MustSkip()) {
    return;
  }

  for (cmSourceFile const* source : sources) {
    cmGeneratorTarget::SourceFileFlags tsFlags =
      this->GT->GetTargetSourceFileFlags(source);
    if (tsFlags.Type != cmGeneratorTarget::SourceFileTypeNormal) {
      (*generator)(*source, tsFlags.MacFolder, config);
    }
  }
}